

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O0

diff_t __thiscall
absl::lts_20240722::time_internal::cctz::detail::difference
          (detail *this,undefined8 param_2,undefined8 param_3,undefined8 param_4)

{
  diff_t dVar1;
  fields f2_local;
  fields f1_local;
  
  dVar1 = difference(this,param_2,param_3,param_4);
  f1_local.y._3_1_ = (char)((ulong)param_2 >> 0x18);
  f2_local.y._3_1_ = (char)((ulong)param_4 >> 0x18);
  dVar1 = impl::scale_add(dVar1,0x3c,(long)((int)f1_local.y._3_1_ - (int)f2_local.y._3_1_));
  return dVar1;
}

Assistant:

CONSTEXPR_F diff_t difference(minute_tag, fields f1, fields f2) noexcept {
  return impl::scale_add(difference(hour_tag{}, f1, f2), 60, (f1.mm - f2.mm));
}